

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_manyvector.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  N_Vector X_00;
  N_Vector W_00;
  N_Vector Y_00;
  N_Vector X_01;
  sunindextype sVar4;
  long lVar5;
  undefined8 uVar6;
  N_Vector p_Var7;
  N_Vector p_Var8;
  long lVar9;
  N_Vector x;
  N_Vector in_RSI;
  int in_EDI;
  N_Vector unaff_retaddr;
  int print_timing;
  N_Vector Z;
  N_Vector Y;
  N_Vector X;
  N_Vector W;
  N_Vector V;
  N_Vector U;
  N_Vector Xsub [2];
  sunindextype length;
  sunindextype len2;
  sunindextype len1;
  int retval;
  int fails;
  N_Vector in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  N_Vector in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  N_Vector in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  N_Vector ID;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar10;
  undefined4 uVar11;
  
  uVar11 = 0;
  iVar10 = 0;
  Test_Init(0x1025ed);
  if (in_EDI < 4) {
    printf(
          "ERROR: THREE (3) Inputs required: subvector 1 length, subvector 2 length, print timing \n"
          );
    Test_Abort(0);
  }
  X_00 = (N_Vector)atol((char *)in_RSI->ops);
  if ((long)X_00 < 1) {
    printf("ERROR: length of subvector 1 must be a positive integer \n");
    Test_Abort(0);
  }
  W_00 = (N_Vector)atol((char *)in_RSI->sunctx);
  if ((long)W_00 < 1) {
    printf("ERROR: length of subvector 2 must be a positive integer \n");
    Test_Abort(0);
  }
  iVar1 = atoi((char *)in_RSI[1].content);
  SetTiming((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90);
  ID = (N_Vector)((long)&W_00->content + (long)&X_00->content);
  printf("Testing ManyVector (serial) N_Vector \n");
  printf("Vector lengths: %ld %ld \n",X_00,W_00);
  Y_00 = (N_Vector)N_VNew_Serial(X_00,sunctx);
  if (Y_00 == (N_Vector)0x0) {
    printf("FAIL: Unable to create a new serial subvector \n\n");
    Test_Abort(0);
  }
  X_01 = (N_Vector)N_VNew_Serial(W_00,sunctx);
  if (X_01 == (N_Vector)0x0) {
    N_VDestroy(Y_00);
    printf("FAIL: Unable to create a new serial subvector \n\n");
    Test_Abort(0);
  }
  sVar4 = N_VNew_ManyVector(2,&stack0xffffffffffffffb8,sunctx);
  iVar2 = Test_N_VGetVectorID(in_stack_ffffffffffffff78,SUNDIALS_NVEC_SERIAL,0x102772);
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VGetLength(in_stack_ffffffffffffff88,iVar1);
  iVar10 = iVar10 + iVar2;
  iVar1 = Test_N_VGetCommunicator(in_stack_ffffffffffffff88,iVar1,in_stack_ffffffffffffff80);
  iVar1 = iVar1 + iVar10;
  lVar5 = N_VGetNumSubvectors_ManyVector(sVar4);
  if (lVar5 != 2) {
    printf(">>> FAILED test -- N_VGetNumSubvectors_ManyVector\n");
    iVar1 = iVar1 + 1;
  }
  uVar6 = N_VGetSubvector_ManyVector(sVar4,0);
  p_Var7 = (N_Vector)N_VGetLength(uVar6);
  if (p_Var7 != X_00) {
    printf(">>> FAILED test -- N_VGetSubvector_ManyVector\n");
    iVar1 = iVar1 + 1;
  }
  p_Var7 = (N_Vector)N_VGetSubvector_ManyVector(sVar4,1);
  p_Var8 = (N_Vector)N_VGetLength(p_Var7);
  if (p_Var8 != W_00) {
    printf(">>> FAILED test -- N_VGetSubvector_ManyVector\n");
    iVar1 = iVar1 + 1;
  }
  p_Var8 = (N_Vector)N_VClone(sVar4);
  if (p_Var8 == (N_Vector)0x0) {
    N_VDestroy(sVar4);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(0);
  }
  lVar5 = N_VClone(sVar4);
  if (lVar5 == 0) {
    N_VDestroy(p_Var8);
    N_VDestroy(sVar4);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(0);
  }
  lVar9 = N_VClone(sVar4);
  if (lVar9 == 0) {
    N_VDestroy(p_Var8);
    N_VDestroy(sVar4);
    N_VDestroy(lVar5);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(0);
  }
  printf("\nTesting standard vector operations:\n\n");
  iVar10 = Test_N_VConst(p_Var8,sVar4,(int)((ulong)lVar5 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VLinearSum(p_Var7,in_stack_ffffffffffffffa8,p_Var8,sVar4,
                            (int)((ulong)lVar5 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VProd(p_Var7,in_stack_ffffffffffffffa8,p_Var8,sVar4,(int)((ulong)lVar5 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VDiv(p_Var7,in_stack_ffffffffffffffa8,p_Var8,sVar4,(int)((ulong)lVar5 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VScale(p_Var7,in_stack_ffffffffffffffa8,(sunindextype)p_Var8,
                         (int)((ulong)sVar4 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VAbs(p_Var7,in_stack_ffffffffffffffa8,(sunindextype)p_Var8,
                      (int)((ulong)sVar4 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VInv(p_Var7,in_stack_ffffffffffffffa8,(sunindextype)p_Var8,
                       (int)((ulong)sVar4 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VAddConst(p_Var7,in_stack_ffffffffffffffa8,(sunindextype)p_Var8,
                           (int)((ulong)sVar4 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VDotProd(X_01,Y_00,(sunindextype)p_Var7,
                           (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VMaxNorm(p_Var7,(sunindextype)in_stack_ffffffffffffffa8,
                          (int)((ulong)p_Var8 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VWrmsNorm(X_01,Y_00,(sunindextype)p_Var7,
                            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VWrmsNormMask
                    (X_00,W_00,ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (int)((ulong)X_01 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VMin(p_Var7,(sunindextype)in_stack_ffffffffffffffa8,(int)((ulong)p_Var8 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VWL2Norm(ID,(N_Vector)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                          ,(sunindextype)X_01,(int)((ulong)Y_00 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VL1Norm(X_01,(sunindextype)Y_00,(int)((ulong)p_Var7 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VCompare(W_00,ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (int)((ulong)X_01 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VInvTest(Y_00,p_Var7,(sunindextype)in_stack_ffffffffffffffa8,
                           (int)((ulong)p_Var8 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VConstrMask((N_Vector)CONCAT44(iVar10,in_stack_ffffffffffffffe8),X_00,W_00,
                             (sunindextype)ID,in_stack_ffffffffffffffcc);
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VMinQuotient(p_Var7,in_stack_ffffffffffffffa8,(sunindextype)p_Var8,
                               (int)((ulong)sVar4 >> 0x20));
  iVar10 = iVar10 + iVar1;
  printf("\nTesting fused and vector array operations (disabled):\n\n");
  p_Var7 = (N_Vector)N_VClone(sVar4);
  iVar1 = N_VEnableFusedOps_ManyVector(p_Var7,0);
  if ((p_Var7 == (N_Vector)0x0) || (iVar1 != 0)) {
    N_VDestroy(p_Var8);
    N_VDestroy(sVar4);
    N_VDestroy(lVar5);
    N_VDestroy(lVar9);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Abort(0);
  }
  iVar1 = Test_N_VLinearCombination(in_RSI,CONCAT44(iVar10,iVar1),(int)((ulong)X_00 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VScaleAddMulti
                     (ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (int)((ulong)X_01 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VDotProdMulti
                    (ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (int)((ulong)X_01 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VLinearSumVectorArray(X_01,(sunindextype)Y_00,(int)((ulong)p_Var7 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VScaleVectorArray
                    (ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (int)((ulong)X_01 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VConstVectorArray
                     (p_Var7,(sunindextype)in_stack_ffffffffffffffa8,(int)((ulong)p_Var8 >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VWrmsNormVectorArray(X_00,(sunindextype)W_00,(int)((ulong)ID >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VWrmsNormMaskVectorArray
                     (unaff_retaddr,CONCAT44(uVar11,in_EDI),(int)((ulong)in_RSI >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VScaleAddMultiVectorArray
                    (unaff_retaddr,CONCAT44(uVar11,in_EDI),(int)((ulong)in_RSI >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VLinearCombinationVectorArray(X_00,(sunindextype)W_00,(int)((ulong)ID >> 0x20));
  iVar10 = iVar10 + iVar1;
  printf("\nTesting fused and vector array operations (enabled):\n\n");
  x = (N_Vector)N_VClone(sVar4);
  iVar1 = N_VEnableFusedOps_ManyVector(x,1);
  if ((x == (N_Vector)0x0) || (iVar1 != 0)) {
    N_VDestroy(p_Var8);
    N_VDestroy(sVar4);
    N_VDestroy(lVar5);
    N_VDestroy(lVar9);
    N_VDestroy(p_Var7);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Abort(0);
  }
  iVar2 = Test_N_VLinearCombination(in_RSI,CONCAT44(iVar10,iVar1),(int)((ulong)X_00 >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VScaleAddMulti
                     (ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (int)((ulong)X_01 >> 0x20));
  iVar10 = iVar10 + iVar2;
  iVar2 = Test_N_VDotProdMulti
                    (ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (int)((ulong)X_01 >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VLinearSumVectorArray(X_01,(sunindextype)Y_00,(int)((ulong)p_Var7 >> 0x20));
  iVar10 = iVar10 + iVar2;
  iVar2 = Test_N_VScaleVectorArray
                    (ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (int)((ulong)X_01 >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VConstVectorArray(p_Var7,(sunindextype)x,(int)((ulong)p_Var8 >> 0x20));
  iVar10 = iVar10 + iVar2;
  iVar2 = Test_N_VWrmsNormVectorArray(X_00,(sunindextype)W_00,(int)((ulong)ID >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VWrmsNormMaskVectorArray
                     (unaff_retaddr,CONCAT44(uVar11,in_EDI),(int)((ulong)in_RSI >> 0x20));
  iVar10 = iVar10 + iVar2;
  iVar2 = Test_N_VScaleAddMultiVectorArray
                    (unaff_retaddr,CONCAT44(uVar11,in_EDI),(int)((ulong)in_RSI >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VLinearCombinationVectorArray(X_00,(sunindextype)W_00,(int)((ulong)ID >> 0x20));
  iVar10 = iVar10 + iVar2;
  printf("\nTesting local reduction operations:\n\n");
  iVar2 = Test_N_VDotProdLocal
                    (ID,(N_Vector)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (sunindextype)X_01,(int)((ulong)Y_00 >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VMaxNormLocal
                     (ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (int)((ulong)X_01 >> 0x20));
  iVar10 = iVar10 + iVar2;
  iVar2 = Test_N_VMinLocal(X_01,(sunindextype)Y_00,(int)((ulong)p_Var7 >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VL1NormLocal(ID,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (int)((ulong)X_01 >> 0x20));
  iVar10 = iVar10 + iVar2;
  iVar2 = Test_N_VWSqrSumLocal
                    (in_RSI,(N_Vector)CONCAT44(iVar10,iVar1),(sunindextype)X_00,
                     (int)((ulong)W_00 >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VWSqrSumMaskLocal
                     (in_RSI,(N_Vector)CONCAT44(iVar2,iVar1),X_00,(sunindextype)W_00,
                      (int)((ulong)ID >> 0x20));
  iVar10 = iVar10 + iVar2;
  iVar2 = Test_N_VInvTestLocal
                    ((N_Vector)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),X_01,
                     (sunindextype)Y_00,(int)((ulong)p_Var7 >> 0x20));
  iVar2 = iVar2 + iVar10;
  iVar10 = Test_N_VConstrMaskLocal
                     ((N_Vector)CONCAT44(iVar2,iVar1),X_00,W_00,(sunindextype)ID,
                      in_stack_ffffffffffffffcc);
  iVar10 = iVar10 + iVar2;
  iVar1 = Test_N_VMinQuotientLocal
                    (ID,(N_Vector)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (sunindextype)X_01,(int)((ulong)Y_00 >> 0x20));
  iVar1 = iVar1 + iVar10;
  printf("\nTesting local fused reduction operations:\n\n");
  iVar10 = Test_N_VDotProdMultiLocal(X_01,(sunindextype)Y_00,(int)((ulong)p_Var7 >> 0x20));
  iVar10 = iVar10 + iVar1;
  printf("\nTesting XBraid interface operations:\n\n");
  iVar1 = Test_N_VBufSize(x,(sunindextype)p_Var8,(int)((ulong)sVar4 >> 0x20));
  iVar1 = iVar1 + iVar10;
  iVar10 = Test_N_VBufPack(Y_00,(sunindextype)p_Var7,(int)((ulong)x >> 0x20));
  iVar10 = iVar10 + iVar1;
  iVar1 = Test_N_VBufUnpack(Y_00,(sunindextype)p_Var7,(int)((ulong)x >> 0x20));
  uVar3 = iVar1 + iVar10;
  N_VDestroy(p_Var8);
  N_VDestroy(sVar4);
  N_VDestroy(lVar5);
  N_VDestroy(lVar9);
  N_VDestroy(p_Var7);
  N_VDestroy(x);
  N_VDestroy(Y_00);
  N_VDestroy(X_01);
  if (uVar3 == 0) {
    printf("SUCCESS: NVector module passed all tests \n\n");
  }
  else {
    printf("FAIL: NVector module failed %i tests \n\n",(ulong)uVar3);
  }
  Test_Finalize();
  return uVar3;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;             /* counter for test failures */
  int retval;                /* function return value     */
  sunindextype len1, len2;   /* vector lengths            */
  sunindextype length;       /* overall vector length     */
  N_Vector Xsub[2];          /* subvector pointer array   */
  N_Vector U, V, W, X, Y, Z; /* test vectors              */
  int print_timing;          /* turn timing on/off        */

  Test_Init(SUN_COMM_NULL);

  /* check input and set vector length */
  if (argc < 4)
  {
    printf("ERROR: THREE (3) Inputs required: subvector 1 length, subvector 2 "
           "length, print timing \n");
    Test_Abort(1);
  }

  len1 = (sunindextype)atol(argv[1]);
  if (len1 <= 0)
  {
    printf("ERROR: length of subvector 1 must be a positive integer \n");
    Test_Abort(1);
  }

  len2 = (sunindextype)atol(argv[2]);
  if (len2 <= 0)
  {
    printf("ERROR: length of subvector 2 must be a positive integer \n");
    Test_Abort(1);
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing, 0);

  /* overall length */
  length = len1 + len2;

  printf("Testing ManyVector (serial) N_Vector \n");
  printf("Vector lengths: %ld %ld \n", (long int)len1, (long int)len2);

  /* Create subvectors */
  Xsub[0] = N_VNew_Serial(len1, sunctx);
  if (Xsub[0] == NULL)
  {
    printf("FAIL: Unable to create a new serial subvector \n\n");
    Test_Abort(1);
  }
  Xsub[1] = N_VNew_Serial(len2, sunctx);
  if (Xsub[1] == NULL)
  {
    N_VDestroy(Xsub[0]);
    printf("FAIL: Unable to create a new serial subvector \n\n");
    Test_Abort(1);
  }

  /* Create a new ManyVector */
  X = N_VNew_ManyVector(2, Xsub, sunctx);

  /* Check vector ID */
  fails += Test_N_VGetVectorID(X, SUNDIALS_NVEC_MANYVECTOR, 0);

  /* Check vector length */
  fails += Test_N_VGetLength(X, 0);

  /* Check vector communicator */
  fails += Test_N_VGetCommunicator(X, SUN_COMM_NULL, 0);

  /* Test subvector accessors */
  if (N_VGetNumSubvectors_ManyVector(X) != 2)
  {
    printf(">>> FAILED test -- N_VGetNumSubvectors_ManyVector\n");
    fails += 1;
  }
  U = N_VGetSubvector_ManyVector(X, 0);
  if (N_VGetLength(U) != len1)
  {
    printf(">>> FAILED test -- N_VGetSubvector_ManyVector\n");
    fails += 1;
  }
  U = N_VGetSubvector_ManyVector(X, 1);
  if (N_VGetLength(U) != len2)
  {
    printf(">>> FAILED test -- N_VGetSubvector_ManyVector\n");
    fails += 1;
  }

  /* Clone additional vectors for testing */
  W = N_VClone(X);
  if (W == NULL)
  {
    N_VDestroy(X);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(1);
  }

  Y = N_VClone(X);
  if (Y == NULL)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(1);
  }

  Z = N_VClone(X);
  if (Z == NULL)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    printf("FAIL: Unable to create a new vector\n\n");
    Test_Abort(1);
  }

  /* Standard vector operation tests */
  printf("\nTesting standard vector operations:\n\n");

  fails += Test_N_VConst(X, length, 0);
  fails += Test_N_VLinearSum(X, Y, Z, length, 0);
  fails += Test_N_VProd(X, Y, Z, length, 0);
  fails += Test_N_VDiv(X, Y, Z, length, 0);
  fails += Test_N_VScale(X, Z, length, 0);
  fails += Test_N_VAbs(X, Z, length, 0);
  fails += Test_N_VInv(X, Z, length, 0);
  fails += Test_N_VAddConst(X, Z, length, 0);
  fails += Test_N_VDotProd(X, Y, length, 0);
  fails += Test_N_VMaxNorm(X, length, 0);
  fails += Test_N_VWrmsNorm(X, Y, length, 0);
  fails += Test_N_VWrmsNormMask(X, Y, Z, length, 0);
  fails += Test_N_VMin(X, length, 0);
  fails += Test_N_VWL2Norm(X, Y, length, 0);
  fails += Test_N_VL1Norm(X, length, 0);
  fails += Test_N_VCompare(X, Z, length, 0);
  fails += Test_N_VInvTest(X, Z, length, 0);
  fails += Test_N_VConstrMask(X, Y, Z, length, 0);
  fails += Test_N_VMinQuotient(X, Y, length, 0);

  /* Fused and vector array operations tests (disabled) */
  printf("\nTesting fused and vector array operations (disabled):\n\n");

  /* create vector and disable all fused and vector array operations */
  U      = N_VClone(X);
  retval = N_VEnableFusedOps_ManyVector(U, SUNFALSE);
  if (U == NULL || retval != 0)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Abort(1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(U, length, 0);
  fails += Test_N_VScaleAddMulti(U, length, 0);
  fails += Test_N_VDotProdMulti(U, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(U, length, 0);
  fails += Test_N_VScaleVectorArray(U, length, 0);
  fails += Test_N_VConstVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(U, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(U, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(U, length, 0);

  /* Fused and vector array operations tests (enabled) */
  printf("\nTesting fused and vector array operations (enabled):\n\n");

  /* create vector and enable all fused and vector array operations */
  V      = N_VClone(X);
  retval = N_VEnableFusedOps_ManyVector(V, SUNTRUE);
  if (V == NULL || retval != 0)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    N_VDestroy(U);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Abort(1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(V, length, 0);
  fails += Test_N_VScaleAddMulti(V, length, 0);
  fails += Test_N_VDotProdMulti(V, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(V, length, 0);
  fails += Test_N_VScaleVectorArray(V, length, 0);
  fails += Test_N_VConstVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(V, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(V, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(V, length, 0);

  /* local reduction operations */
  printf("\nTesting local reduction operations:\n\n");

  fails += Test_N_VDotProdLocal(X, Y, length, 0);
  fails += Test_N_VMaxNormLocal(X, length, 0);
  fails += Test_N_VMinLocal(X, length, 0);
  fails += Test_N_VL1NormLocal(X, length, 0);
  fails += Test_N_VWSqrSumLocal(X, Y, length, 0);
  fails += Test_N_VWSqrSumMaskLocal(X, Y, Z, length, 0);
  fails += Test_N_VInvTestLocal(X, Z, length, 0);
  fails += Test_N_VConstrMaskLocal(X, Y, Z, length, 0);
  fails += Test_N_VMinQuotientLocal(X, Y, length, 0);

  /* local fused reduction operations */
  printf("\nTesting local fused reduction operations:\n\n");
  fails += Test_N_VDotProdMultiLocal(V, length, 0);

  /* XBraid interface operations */
  printf("\nTesting XBraid interface operations:\n\n");

  fails += Test_N_VBufSize(X, length, 0);
  fails += Test_N_VBufPack(X, length, 0);
  fails += Test_N_VBufUnpack(X, length, 0);

  /* Free vectors */
  N_VDestroy(W);
  N_VDestroy(X);
  N_VDestroy(Y);
  N_VDestroy(Z);
  N_VDestroy(U);
  N_VDestroy(V);
  N_VDestroy(Xsub[0]);
  N_VDestroy(Xsub[1]);

  /* Print result */
  if (fails) { printf("FAIL: NVector module failed %i tests \n\n", fails); }
  else { printf("SUCCESS: NVector module passed all tests \n\n"); }

  Test_Finalize();
  return (fails);
}